

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O1

ssize_t __thiscall Peer::read_abi_cxx11_(Peer *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  Socket __fd_00;
  int iVar2;
  ssize_t sVar3;
  Events *this_00;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar4;
  Peers *this_01;
  undefined8 *puVar5;
  long *plVar6;
  int *piVar7;
  long *plVar8;
  ulong *puVar9;
  undefined4 in_register_00000034;
  Peer *args;
  vector<char,_std::allocator<char>_> buf;
  ulong *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  vector<char,_std::allocator<char>_> local_c8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  args = (Peer *)CONCAT44(in_register_00000034,__fd);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_c8,(long)(int)__buf,(allocator_type *)&local_e8);
  __fd_00 = SocketResource::resource(&args->m_socket);
  sVar3 = recv(__fd_00,local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,(long)(int)__buf,0x40);
  iVar2 = (int)sVar3;
  if (iVar2 == 0) {
    args->m_connected = false;
    this_00 = P2PSocket::events(args->m_master);
    puVar4 = Events::onPeerDisconnect(this_00);
    Event::trigger<Peer*>
              ((puVar4->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
               super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
               super__Head_base<0UL,_Event_*,_false>._M_head_impl,args);
    this_01 = P2PSocket::peers(args->m_master);
    Peers::remove(this_01,(char *)args);
    this->m_master = (P2PSocket *)&(this->m_name)._M_string_length;
    (this->m_name)._M_dataplus._M_p = (pointer)0x0;
    *(undefined1 *)&(this->m_name)._M_string_length = 0;
  }
  else {
    if (iVar2 == -1) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x20);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Failed to read peer ","")
      ;
      std::operator+(&local_50,&local_70,&args->m_name);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar6;
      plVar8 = plVar6 + 2;
      if (local_b0 == plVar8) {
        local_a0 = *plVar8;
        lStack_98 = plVar6[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar8;
      }
      local_a8 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      piVar7 = __errno_location();
      strerror(*piVar7);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_90 = (long *)*plVar6;
      plVar8 = plVar6 + 2;
      if (local_90 == plVar8) {
        local_80 = *plVar8;
        lStack_78 = plVar6[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar8;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_e8 = (ulong *)*plVar6;
      puVar9 = (ulong *)(plVar6 + 2);
      if (local_e8 == puVar9) {
        local_d8 = *puVar9;
        uStack_d0 = (undefined4)plVar6[3];
        uStack_cc = *(undefined4 *)((long)plVar6 + 0x1c);
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *puVar9;
      }
      lVar1 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      *puVar5 = puVar5 + 2;
      if (local_e8 == &local_d8) {
        *(undefined4 *)(puVar5 + 2) = (undefined4)local_d8;
        *(undefined4 *)((long)puVar5 + 0x14) = local_d8._4_4_;
        *(undefined4 *)(puVar5 + 3) = uStack_d0;
        *(undefined4 *)((long)puVar5 + 0x1c) = uStack_cc;
      }
      else {
        *puVar5 = local_e8;
        puVar5[2] = local_d8;
      }
      puVar5[1] = lVar1;
      local_e0 = 0;
      local_d8 = local_d8 & 0xffffffffffffff00;
      local_e8 = &local_d8;
      __cxa_throw(puVar5,&PeerException::typeinfo,PeerException::~PeerException);
    }
    std::vector<char,_std::allocator<char>_>::resize(&local_c8,(long)iVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this,
               local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,(allocator<char> *)&local_e8);
  }
  if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (ssize_t)this;
}

Assistant:

std::string Peer::read(const int length)
{
    std::vector<char> buf(length);
    int recv = ::recv(m_socket.resource(), &buf[0], length, MSG_DONTWAIT);
    if (recv == -1) {
        throw PeerException(std::string{"Failed to read peer "} + m_name + " " +
                            std::strerror(errno) + "\n");
    }
    if (recv == 0) {
        // Connection is no longer valid, remote has been disconnected
        m_connected = false;
        this->m_master->events()->onPeerDisconnect()->trigger(this);
        this->m_master->peers()->remove(this);
        return std::string{};
    }
    buf.resize(recv);
    return std::string{buf.data()};
}